

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_palloc.c
# Opt level: O2

void * ngx_palloc_large(ngx_pool_t *pool,size_t size)

{
  ngx_pool_large_t **ppnVar1;
  void *__ptr;
  long lVar2;
  ngx_pool_large_t *pnVar3;
  
  __ptr = ngx_alloc(size,pool->log);
  if (__ptr != (void *)0x0) {
    ppnVar1 = &pool->large;
    lVar2 = 5;
    pnVar3 = (ngx_pool_large_t *)ppnVar1;
    do {
      pnVar3 = pnVar3->next;
      if (pnVar3 == (ngx_pool_large_t *)0x0) break;
      if (pnVar3->alloc == (void *)0x0) {
        pnVar3->alloc = __ptr;
        return __ptr;
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    pnVar3 = (ngx_pool_large_t *)ngx_palloc_small(pool,0x10,1);
    if (pnVar3 != (ngx_pool_large_t *)0x0) {
      pnVar3->alloc = __ptr;
      pnVar3->next = *ppnVar1;
      *ppnVar1 = pnVar3;
      return __ptr;
    }
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

static void *
ngx_palloc_large(ngx_pool_t *pool, size_t size)
{
    void              *p;
    ngx_uint_t         n;
    ngx_pool_large_t  *large;

    p = ngx_alloc(size, pool->log);
    if (p == NULL) {
        return NULL;
    }

    n = 0;

    for (large = pool->large; large; large = large->next) {
        if (large->alloc == NULL) {
            large->alloc = p;
            return p;
        }

        if (n++ > 3) {
            break;
        }
    }

    large = ngx_palloc_small(pool, sizeof(ngx_pool_large_t), 1);
    if (large == NULL) {
        ngx_free(p);
        return NULL;
    }

    large->alloc = p;
    large->next = pool->large;
    pool->large = large;

    return p;
}